

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

void __thiscall QTemporaryDir::~QTemporaryDir(QTemporaryDir *this)

{
  QTemporaryDirPrivate *pQVar1;
  char *in_RSI;
  QTemporaryDir *in_RDI;
  
  if (in_RDI->d_ptr != (QTemporaryDirPrivate *)0x0) {
    if ((in_RDI->d_ptr->autoRemove & 1U) != 0) {
      remove(in_RDI,in_RSI);
    }
    pQVar1 = in_RDI->d_ptr;
    if (pQVar1 != (QTemporaryDirPrivate *)0x0) {
      QTemporaryDirPrivate::~QTemporaryDirPrivate((QTemporaryDirPrivate *)0x2f6c24);
      operator_delete(pQVar1,0x20);
    }
  }
  return;
}

Assistant:

QTemporaryDir::~QTemporaryDir()
{
    if (d_ptr) {
        if (d_ptr->autoRemove)
            remove();

        delete d_ptr;
    }
}